

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::CallbackErrorCase::expectMessage
          (CallbackErrorCase *this,GLenum source,GLenum type)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  MessageData local_48;
  GLenum local_18;
  GLenum local_14;
  GLenum type_local;
  GLenum source_local;
  CallbackErrorCase *this_local;
  
  local_18 = type;
  local_14 = source;
  _type_local = this;
  BaseCase::verifyMessage(&this->super_BaseCase,&this->m_lastMessage,source,type);
  MessageData::MessageData(&local_48);
  MessageData::operator=(&this->m_lastMessage,&local_48);
  MessageData::~MessageData(&local_48);
  pRVar2 = gles31::Context::getRenderContext
                     ((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  return;
}

Assistant:

void CallbackErrorCase::expectMessage (GLenum source, GLenum type)
{
	verifyMessage(m_lastMessage, source, type);
	m_lastMessage = MessageData();

	// Reset error so that code afterwards (such as glu::ShaderProgram) doesn't break because of
	// lingering error state.
	m_context.getRenderContext().getFunctions().getError();
}